

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool __thiscall cfd::core::Script::IsWitnessProgram(Script *this)

{
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  const_reference pvVar4;
  ScriptOperator *this_00;
  ByteData local_40;
  size_t hash_size;
  Script *pSStack_18;
  ScriptType op_code;
  Script *this_local;
  
  pSStack_18 = this;
  sVar2 = ByteData::GetDataSize(&this->script_data_);
  if (((3 < sVar2) && (sVar2 = ByteData::GetDataSize(&this->script_data_), sVar2 < 0x2b)) &&
     (sVar3 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
              size(&this->script_stack_), sVar3 == 2)) {
    pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[](&this->script_stack_,0);
    bVar1 = ScriptElement::IsOpCode(pvVar4);
    if (bVar1) {
      pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[](&this->script_stack_,1);
      bVar1 = ScriptElement::IsBinary(pvVar4);
      if (bVar1) {
        pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&this->script_stack_,0);
        this_00 = ScriptElement::GetOpCode(pvVar4);
        hash_size._4_4_ = ScriptOperator::GetDataType(this_00);
        if ((hash_size._4_4_ != kOpFalse) &&
           (((int)hash_size._4_4_ < 0x51 || (0x60 < (int)hash_size._4_4_)))) {
          return false;
        }
        pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&this->script_stack_,1);
        ScriptElement::GetBinaryData(&local_40,pvVar4);
        sVar2 = ByteData::GetDataSize(&local_40);
        ByteData::~ByteData(&local_40);
        if (hash_size._4_4_ == kOpFalse) {
          if ((sVar2 != 0x14) && (sVar2 != 0x20)) {
            return false;
          }
        }
        else if ((hash_size._4_4_ == kOpTrue) && (sVar2 != 0x20)) {
          return false;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Script::IsWitnessProgram() const {
  if ((script_data_.GetDataSize() < kMinWitnessProgramLength) ||
      (kMaxWitnessProgramLength < script_data_.GetDataSize()) ||
      (script_stack_.size() != 2) || (!script_stack_[0].IsOpCode()) ||
      (!script_stack_[1].IsBinary())) {
    return false;
  }
  auto op_code = script_stack_[0].GetOpCode().GetDataType();
  if ((op_code != ScriptType::kOp_0) &&
      ((op_code < ScriptType::kOp_1) || (op_code > ScriptType::kOp_16))) {
    return false;
  }

  auto hash_size = script_stack_[1].GetBinaryData().GetDataSize();
  if (op_code == ScriptType::kOp_0) {
    if ((hash_size != 0x14) && (hash_size != 0x20)) return false;
  } else if (op_code == ScriptType::kOp_1) {
    if (hash_size != 0x20) return false;
  }
  return true;
}